

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O2

uint Abc_NtkDontCareCofactors_rec(Odc_Man_t *p,Odc_Lit_t Lit,uint uMask)

{
  Odc_Lit_t OVar1;
  Odc_Lit_t OVar2;
  uint uVar3;
  uint uVar4;
  Odc_Obj_t *pOVar5;
  
  if ((Lit & 1) != 0) {
    __assert_fail("!Odc_IsComplement(Lit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcOdc.c"
                  ,0x2e7,
                  "unsigned int Abc_NtkDontCareCofactors_rec(Odc_Man_t *, Odc_Lit_t, unsigned int)")
    ;
  }
  pOVar5 = Odc_Lit2Obj(p,Lit);
  if (pOVar5->TravId == p->nTravIds) {
    uVar3 = pOVar5->uData;
  }
  else {
    pOVar5->TravId = p->nTravIds;
    if ((pOVar5->uMask & uMask) == 0) {
      uVar3 = (uint)Lit * 0x10001;
    }
    else {
      if ((pOVar5->uMask == uMask) && ((int)(uint)(Lit >> 1) <= p->nPis)) {
        pOVar5->uData = 1;
        return 1;
      }
      uVar3 = Abc_NtkDontCareCofactors_rec(p,pOVar5->iFan0 & 0xfffe,uMask);
      uVar4 = Abc_NtkDontCareCofactors_rec(p,pOVar5->iFan1 & 0xfffe,uMask);
      OVar1 = Odc_And(p,pOVar5->iFan0 & 1 ^ (ushort)uVar3,pOVar5->iFan1 & 1 ^ (ushort)uVar4);
      OVar2 = Odc_And(p,pOVar5->iFan0 & 1 ^ (ushort)(uVar3 >> 0x10),
                      pOVar5->iFan1 & 1 ^ (ushort)(uVar4 >> 0x10));
      uVar3 = CONCAT22(OVar2,OVar1);
    }
    pOVar5->uData = uVar3;
  }
  return uVar3;
}

Assistant:

unsigned Abc_NtkDontCareCofactors_rec( Odc_Man_t * p, Odc_Lit_t Lit, unsigned uMask )
{
    Odc_Obj_t * pObj;
    unsigned uData0, uData1;
    Odc_Lit_t uLit0, uLit1, uRes0, uRes1;
    assert( !Odc_IsComplement(Lit) );
    // skip visited objects
    pObj = Odc_Lit2Obj( p, Lit );
    if ( Odc_ObjIsTravIdCurrent(p, pObj) )
        return pObj->uData;
    Odc_ObjSetTravIdCurrent(p, pObj);
    // skip objects out of the cone
    if ( (pObj->uMask & uMask) == 0 )
        return pObj->uData = ((Lit << 16) | Lit);
    // consider the case when the node is the var
    if ( pObj->uMask == uMask && Odc_IsTerm(p, Lit) )
        return pObj->uData = ((Odc_Const1() << 16) | Odc_Const0());
    // compute the cofactors
    uData0 = Abc_NtkDontCareCofactors_rec( p, Odc_ObjFanin0(pObj), uMask );
    uData1 = Abc_NtkDontCareCofactors_rec( p, Odc_ObjFanin1(pObj), uMask );
    // find the 0-cofactor
    uLit0 = Odc_NotCond( (Odc_Lit_t)(uData0 & 0xffff), Odc_ObjFaninC0(pObj) );
    uLit1 = Odc_NotCond( (Odc_Lit_t)(uData1 & 0xffff), Odc_ObjFaninC1(pObj) );
    uRes0 = Odc_And( p, uLit0, uLit1 );
    // find the 1-cofactor
    uLit0 = Odc_NotCond( (Odc_Lit_t)(uData0 >> 16), Odc_ObjFaninC0(pObj) );
    uLit1 = Odc_NotCond( (Odc_Lit_t)(uData1 >> 16), Odc_ObjFaninC1(pObj) );
    uRes1 = Odc_And( p, uLit0, uLit1 );
    // find the result
    return pObj->uData = ((uRes1 << 16) | uRes0);
}